

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libtelnet.c
# Opt level: O3

void telnet_recv(telnet_t *telnet,char *buffer,size_t size)

{
  uint uVar1;
  undefined8 uVar2;
  z_stream *pzVar3;
  telnet_event_t ev;
  char inflate_buffer [1024];
  telnet_event_t local_440;
  Bytef local_418 [1024];
  
  pzVar3 = telnet->z;
  if ((pzVar3 == (z_stream *)0x0) || ((char)telnet->flags < '\0')) {
    _process(telnet,buffer,size);
    return;
  }
  pzVar3->next_in = (Bytef *)buffer;
  pzVar3->avail_in = (uInt)size;
  pzVar3->next_out = local_418;
  pzVar3->avail_out = 0x400;
  while( true ) {
    if (pzVar3->avail_in == 0) {
      return;
    }
    uVar1 = inflate(pzVar3,2);
    if (1 < uVar1) break;
    _process(telnet,(char *)local_418,0x400 - (ulong)telnet->z->avail_out);
    pzVar3 = telnet->z;
    pzVar3->next_out = local_418;
    pzVar3->avail_out = 0x400;
    if (uVar1 != 0) {
LAB_0010247d:
      inflateEnd();
      free(telnet->z);
      telnet->z = (z_stream *)0x0;
      local_440.type = TELNET_EV_COMPRESS;
      local_440.iac.cmd = '\0';
      (*telnet->eh)(telnet,&local_440,telnet->ud);
      return;
    }
  }
  uVar2 = zError(uVar1);
  _error(telnet,0x519,"telnet_recv",TELNET_ECOMPRESS,1,"inflate() failed: %s",uVar2);
  pzVar3 = telnet->z;
  pzVar3->next_out = local_418;
  pzVar3->avail_out = 0x400;
  goto LAB_0010247d;
}

Assistant:

void telnet_recv(telnet_t *telnet, const char *buffer,
		size_t size) {
#if defined(HAVE_ZLIB)
	/* if we have an inflate (decompression) zlib stream, use it */
	if (telnet->z != 0 && !(telnet->flags & TELNET_PFLAG_DEFLATE)) {
		char inflate_buffer[1024];
		int rs;

		/* initialize zlib state */
		telnet->z->next_in = (unsigned char*)buffer;
		telnet->z->avail_in = (unsigned int)size;
		telnet->z->next_out = (unsigned char *)inflate_buffer;
		telnet->z->avail_out = sizeof(inflate_buffer);

		/* inflate until buffer exhausted and all output is produced */
		while (telnet->z->avail_in > 0 || telnet->z->avail_out == 0) {
			/* reset output buffer */

			/* decompress */
			rs = inflate(telnet->z, Z_SYNC_FLUSH);

			/* process the decompressed bytes on success */
			if (rs == Z_OK || rs == Z_STREAM_END)
				_process(telnet, inflate_buffer, sizeof(inflate_buffer) -
						telnet->z->avail_out);
			else
				_error(telnet, __LINE__, __func__, TELNET_ECOMPRESS, 1,
						"inflate() failed: %s", zError(rs));

			/* prepare output buffer for next run */
			telnet->z->next_out = (unsigned char *)inflate_buffer;
			telnet->z->avail_out = sizeof(inflate_buffer);

			/* on error (or on end of stream) disable further inflation */
			if (rs != Z_OK) {
				telnet_event_t ev;

				/* disable compression */
				inflateEnd(telnet->z);
				free(telnet->z);
				telnet->z = 0;

				/* send event */
				ev.type = TELNET_EV_COMPRESS;
				ev.compress.state = 0;
				telnet->eh(telnet, &ev, telnet->ud);

				break;
			}
		}

	/* COMPRESS2 is not negotiated, just process */
	} else
#endif /* defined(HAVE_ZLIB) */
		_process(telnet, buffer, size);
}